

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

bool __thiscall
Catch::Matchers::Impl::Generic::
AllOf<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::match
          (AllOf<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *expr)

{
  pointer pPVar1;
  Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pMVar2;
  char cVar3;
  int iVar4;
  ulong uVar5;
  bool bVar6;
  
  pPVar1 = (this->m_matchers).
           super__Vector_base<Catch::Ptr<Catch::Matchers::Impl::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<Catch::Ptr<Catch::Matchers::Impl::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  bVar6 = (this->m_matchers).
          super__Vector_base<Catch::Ptr<Catch::Matchers::Impl::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<Catch::Ptr<Catch::Matchers::Impl::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish == pPVar1;
  if ((!bVar6) &&
     (iVar4 = (*(pPVar1->m_p->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable.
                _vptr_NonCopyable[5])(), (char)iVar4 != '\0')) {
    uVar5 = 1;
    do {
      pPVar1 = (this->m_matchers).
               super__Vector_base<Catch::Ptr<Catch::Matchers::Impl::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<Catch::Ptr<Catch::Matchers::Impl::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      bVar6 = (ulong)((long)(this->m_matchers).
                            super__Vector_base<Catch::Ptr<Catch::Matchers::Impl::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<Catch::Ptr<Catch::Matchers::Impl::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar1 >> 3) <= uVar5
      ;
      if (bVar6) {
        return bVar6;
      }
      pMVar2 = pPVar1[uVar5].m_p;
      cVar3 = (**(code **)((long)(pMVar2->super_SharedImpl<Catch::IShared>).super_IShared.
                                 super_NonCopyable + 0x28))(pMVar2,expr);
      uVar5 = uVar5 + 1;
    } while (cVar3 != '\0');
  }
  return bVar6;
}

Assistant:

virtual bool match( ExpressionT const& expr ) const
            {
                for( std::size_t i = 0; i < m_matchers.size(); ++i )
                    if( !m_matchers[i]->match( expr ) )
                        return false;
                return true;
            }